

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreIncompleteTexturesTest::Run
          (ImageLoadStoreIncompleteTexturesTest *this)

{
  CallLogWrapper *this_00;
  pointer *ppuVar1;
  GLuint GVar2;
  GLuint texture_id;
  GLuint texture_id_00;
  GLuint texture_id_01;
  GLuint i;
  GLenum GVar3;
  GLuint index;
  int iVar4;
  int iVar5;
  ulong uVar6;
  InternalError *this_01;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_texture_data;
  
  GVar2 = this->m_complete_destination_texture_id;
  texture_id = this->m_complete_source_texture_id;
  texture_id_00 = this->m_incomplete_destination_texture_id;
  texture_id_01 = this->m_incomplete_source_texture_id;
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program_id);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fc2);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array_object_id);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fc6);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer_id);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fca);
  index = glu::CallLogWrapper::glGetAttribLocation(this_00,this->m_program_id,"vs_in_position");
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"GetAttribLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fce);
  if (index == 0xffffffff) {
    this_01 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_01,"Attribute location is not available","vs_in_position",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x1fd2);
    __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  glu::CallLogWrapper::glVertexAttribPointer(this_00,index,4,0x1406,'\0',0,(void *)0x0);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"VertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fd6);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,index);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"EnableVertexAttribArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fd9);
  BindTextureToImage(this,this->m_program_id,GVar2,0,"u_complete_destination_image");
  BindTextureToImage(this,this->m_program_id,texture_id,1,"u_complete_source_image");
  BindTextureToImage(this,this->m_program_id,texture_id_00,2,"u_incomplete_destination_image");
  BindTextureToImage(this,this->m_program_id,texture_id_01,3,"u_incomplete_source_image");
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fe7);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0xffffffff);
  GVar2 = this->m_incomplete_destination_texture_id;
  uVar6 = (ulong)(this->m_texture_edge * this->m_texture_edge * 4);
  expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&expected_texture_data,uVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&texture_data,uVar6);
  uVar8 = this->m_texture_edge;
  iVar4 = 0;
  for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    uVar9 = uVar8 * iVar4;
    for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
      expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar9] = (uchar)uVar10;
      expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[(ulong)uVar9 + 1] = (uchar)uVar7;
      (expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start + (ulong)uVar9 + 2)[0] = '3';
      (expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start + (ulong)uVar9 + 2)[1] = 0xcc;
      uVar8 = this->m_texture_edge;
      uVar9 = uVar9 + 4;
    }
    iVar4 = iVar4 + 4;
  }
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,GVar2);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fa0);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1908,0x1401,
             texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1fa3);
  iVar4 = bcmp(texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               expected_texture_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,uVar6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected_texture_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (iVar4 != 0) {
    expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_testCtx->m_log;
    ppuVar1 = &expected_texture_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,
                    "Problem with imageStore, operation modified contents of incomplete texture");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&expected_texture_data,(EndMessageToken *)&tcu::TestLog::EndMessage
              );
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  }
  GVar2 = this->m_complete_destination_texture_id;
  uVar10 = (ulong)(this->m_texture_edge * this->m_texture_edge * 4);
  expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&expected_texture_data,uVar10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&texture_data,uVar10);
  for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
    expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = '\0';
  }
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,GVar2);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1f72);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1908,0x1401,
             texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1f75);
  iVar5 = bcmp(texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               expected_texture_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,uVar10);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected_texture_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (iVar5 == 0) {
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    expected_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  m_context)->m_testCtx->m_log;
    ppuVar1 = &expected_texture_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,
                    "Problem with imageLoad, operation returned non 0 result for incomplete texture"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&expected_texture_data,(EndMessageToken *)&tcu::TestLog::EndMessage
              );
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		bool result = true;

		/* Copy textures data with imageLoad() and imageStore() operations */
		Copy2DRGBA8Textures(m_complete_destination_texture_id, m_incomplete_destination_texture_id,
							m_complete_source_texture_id, m_incomplete_source_texture_id);

		glMemoryBarrier(GL_ALL_BARRIER_BITS);

		/* Verify that store to "incomplete destination" was ignored */
		if (true ==
			CheckIfTextureWasModified(m_incomplete_destination_texture_id, m_incomplete_destination_magic_number))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Problem with imageStore, operation modified contents of incomplete texture"
				<< tcu::TestLog::EndMessage;

			result = false;
		}

		/* Verify that load from "incomplete source" returned 0 */
		if (false == CheckIfTextureIsBlack(m_complete_destination_texture_id))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Problem with imageLoad, operation returned non 0 result for incomplete texture"
				<< tcu::TestLog::EndMessage;

			result = false;
		}

		if (false == result)
		{
			return ERROR;
		}

		/* Done */
		return NO_ERROR;
	}